

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat_room.cpp
# Opt level: O0

void __thiscall ChatRoom::broadcast(ChatRoom *this,string *origin,string *message)

{
  bool bVar1;
  __shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  shared_ptr<Person> *p;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_> *__range1;
  string *message_local;
  string *origin_local;
  ChatRoom *this_local;
  
  __end1 = std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>::begin
                     (&this->m_people);
  p = (shared_ptr<Person> *)
      std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>::end
                (&this->m_people);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
                                     *)&p), bVar1) {
    this_00 = (__shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
              ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (this_00);
    bVar1 = std::operator!=(&peVar2->m_name,origin);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      Person::recieve(peVar2,origin,message);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ChatRoom::broadcast(const std::string& origin, const std::string& message)
{
	for(auto& p : m_people)
	{
		if(p->m_name != origin)
		{
			p->recieve(origin, message);
		}
	}
}